

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O3

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::EndArray(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,SizeType memberCount)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  
  pcVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  (this->
  super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ).level_stack_.stackTop_ = pcVar1 + -0x10;
  if ((*(long *)(pcVar1 + -0x10) != 0) && (pcVar1[-7] == '\0')) {
    this_00 = &((this->
                super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                ).os_)->stack_;
    pcVar1 = this_00->stackTop_;
    if (this_00->stackEnd_ == pcVar1 || (long)this_00->stackEnd_ - (long)pcVar1 < 0) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,1);
      pcVar1 = this_00->stackTop_;
    }
    this_00->stackTop_ = pcVar1 + 1;
    *pcVar1 = '\n';
    WriteIndent(this);
  }
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::WriteEndArray(&this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 );
  return true;
}

Assistant:

bool EndArray(SizeType memberCount = 0) {
        (void)memberCount;
        RAPIDJSON_ASSERT(Base::level_stack_.GetSize() >= sizeof(typename Base::Level));
        RAPIDJSON_ASSERT(Base::level_stack_.template Top<typename Base::Level>()->inArray);
        typename Base::Level* level = Base::level_stack_.template Pop<typename Base::Level>(1);
        bool empty = level->valueCount == 0;

        if (!empty && !level->inLine) {
            Base::os_->Put('\n');
            WriteIndent();
        }
        bool ret = Base::EndValue(Base::WriteEndArray());
        (void)ret;
        RAPIDJSON_ASSERT(ret == true);
        if (Base::level_stack_.Empty()) // end of json text
            Base::Flush();
        return true;
    }